

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O1

size_t tlv_get_tlvar(uint8_t *buf,size_t buflen,uint32_t *var)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  
  bVar1 = *buf;
  uVar3 = (uint)bVar1;
  if (buflen == 0 || 0xfc < bVar1) {
    if (buflen < 3 || bVar1 != 0xfd) {
      if (buflen < 5 || bVar1 != 0xfe) {
        return 0;
      }
      uVar3 = *(uint *)(buf + 1);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      sVar2 = 5;
    }
    else {
      uVar3 = (uint)(ushort)(*(ushort *)(buf + 1) << 8 | *(ushort *)(buf + 1) >> 8);
      sVar2 = 3;
    }
  }
  else {
    sVar2 = 1;
  }
  *var = uVar3;
  return sVar2;
}

Assistant:

size_t
tlv_get_tlvar(uint8_t* buf, size_t buflen, uint32_t* var){
  uint8_t first_byte = buf[0];
  if(first_byte < 253 && buflen >= 1){
    *var = first_byte;
    return 1;
  }
  else if(first_byte == 253 && buflen >= 3) {
    *var = ((uint32_t)buf[1] << 8) + buf[2];
    return 3;
  }
  else if (first_byte == 254 && buflen >= 5) {
    *var = ((uint32_t)buf[1] << 24) +
           ((uint32_t)buf[2] << 16) +
           ((uint32_t)buf[3] << 8) +
           ((uint32_t)buf[4]);
    return 5;
  }
  else {
    return 0;
  }
}